

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_keterangan(void)

{
  allocator local_241;
  string local_240 [32];
  undefined4 local_220;
  allocator local_219;
  string local_218 [32];
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  undefined4 local_1d0;
  allocator local_1c9;
  string local_1c8 [32];
  undefined4 local_1a8;
  allocator local_1a1;
  string local_1a0 [32];
  undefined4 local_180;
  allocator local_179;
  string local_178 [32];
  undefined4 local_158;
  allocator local_151;
  string local_150 [32];
  undefined4 local_130;
  allocator local_129;
  string local_128 [32];
  undefined4 local_108;
  allocator local_101;
  string local_100 [32];
  undefined4 local_e0;
  allocator local_d9;
  string local_d8 [32];
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [32];
  undefined4 local_90;
  allocator local_89;
  string local_88 [32];
  undefined4 local_68;
  allocator local_61;
  string local_60 [32];
  undefined4 local_40;
  allocator local_29;
  string local_28 [32];
  
  KumpulanKubus::print(kubus,(FrameBuffer *)fb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"STEI",&local_29);
  local_40 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_28,0x44c,100,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"FMIPA",&local_61);
  local_68 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_60,0x44c,0x78,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"FSRD",&local_89);
  local_90 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_88,0x44c,0x8c,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"SAPPK",&local_b1);
  local_b8 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_b0,0x44c,0xa0,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"FTTM",&local_d9);
  local_e0 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_d8,0x44c,0xb4,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"SITH",&local_101);
  local_108 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_100,0x44c,200,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"FTI",&local_129);
  local_130 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_128,0x44c,0xdc,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"FITB",&local_151);
  local_158 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_150,0x44c,0xf0,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"FTMD",&local_179);
  local_180 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_178,0x44c,0x104,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"FTSL",&local_1a1);
  local_1a8 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_1a0,0x44c,0x118,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"SF",&local_1c9);
  local_1d0 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_1c8,0x44c,300,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"SBM",&local_1f1);
  local_1f8 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_1f0,0x44c,0x140,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"UMUM",&local_219);
  local_220 = (undefined4)Color::WHITE;
  Font::print(&font,fb,local_218,0x44c,0x154,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"OTHER",&local_241);
  Font::print(&font,fb,local_240,0x44c,0x168,3,(undefined4)Color::WHITE);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  return;
}

Assistant:

void print_keterangan() {
  kubus->print(fb);
  font.print(fb, "STEI", UJUNG_X2, UJUNG_Y2, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FMIPA", UJUNG_X2, UJUNG_Y2+20, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FSRD", UJUNG_X2, UJUNG_Y2+40, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SAPPK", UJUNG_X2, UJUNG_Y2+60, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTTM", UJUNG_X2, UJUNG_Y2+80, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SITH", UJUNG_X2, UJUNG_Y2+100, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTI", UJUNG_X2, UJUNG_Y2+120, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FITB", UJUNG_X2, UJUNG_Y2+140, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTMD", UJUNG_X2, UJUNG_Y2+160, FONT_SIZE2, Color::WHITE);
  font.print(fb, "FTSL", UJUNG_X2, UJUNG_Y2+180, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SF", UJUNG_X2, UJUNG_Y2+200, FONT_SIZE2, Color::WHITE);
  font.print(fb, "SBM", UJUNG_X2, UJUNG_Y2+220, FONT_SIZE2, Color::WHITE);
  font.print(fb, "UMUM", UJUNG_X2, UJUNG_Y2+240, FONT_SIZE2, Color::WHITE);
  font.print(fb, "OTHER", UJUNG_X2, UJUNG_Y2+260, FONT_SIZE2, Color::WHITE);
}